

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::handleRegister
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *profile,
          TString *desc,int subComponent,TString *spaceDesc)

{
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  TQualifier *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  const_reference pvVar6;
  char *pcVar7;
  size_type sVar8;
  char *__s2;
  undefined1 local_98 [8];
  anon_class_16_2_916c425d crackSpace;
  uint setNumber;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *resourceInfo;
  int local_38;
  int local_34;
  int regNumber;
  int subComponent_local;
  TString *desc_local;
  TString *profile_local;
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  local_34 = subComponent;
  _regNumber = desc;
  desc_local = profile;
  profile_local = (TString *)qualifier;
  qualifier_local = (TQualifier *)loc;
  loc_local = (TSourceLoc *)this;
  if (profile != (TString *)0x0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this,loc,"ignoring shader_profile","register","");
  }
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          size(_regNumber);
  if (sVar5 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,qualifier_local,"expected register type","register","");
    return;
  }
  local_38 = 0;
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          size(_regNumber);
  if (1 < sVar5) {
    pvVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::operator[]
                       (_regNumber,1);
    iVar3 = isdigit((int)*pvVar6);
    this_00 = _regNumber;
    if (iVar3 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,qualifier_local,"expected register number after register type","register","");
      return;
    }
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::size(_regNumber);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &resourceInfo,this_00,1,sVar5);
    pcVar7 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)&resourceInfo);
    local_38 = atoi(pcVar7);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  &resourceInfo);
  }
  it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       TIntermediate::getResourceSetBinding_abi_cxx11_
                 ((this->super_TParseContextBase).super_TParseVersions.intermediate);
  pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::operator[](_regNumber,0);
  iVar3 = tolower((int)*pvVar6);
  pTVar1 = qualifier_local;
  if (iVar3 != 0x62) {
    if (iVar3 == 99) {
      *(int *)((long)&profile_local->_M_string_length + 4) = local_38 << 4;
      goto LAB_00644ccf;
    }
    if (2 < iVar3 - 0x73U) {
      pvVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
               operator[](_regNumber,0);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,pTVar1,"ignoring unrecognized register type","register","%c",
                 (ulong)(uint)(int)*pvVar6);
      goto LAB_00644ccf;
    }
  }
  bVar2 = TQualifier::hasBinding((TQualifier *)profile_local);
  if (!bVar2) {
    *(ulong *)((long)&profile_local->field_2 + 4) =
         *(ulong *)((long)&profile_local->field_2 + 4) & 0xffff0000ffffffff |
         ((ulong)(uint)(local_38 + local_34) & 0xffff) << 0x20;
  }
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)it._M_current);
  if (sVar8 % 3 == 0) {
    local_70._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::cbegin(it._M_current);
    while( true ) {
      local_78._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::cend(it._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_70,&local_78);
      if (!bVar2) break;
      pcVar7 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (_regNumber);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&local_70,0);
      __s2 = (char *)std::__cxx11::string::c_str();
      iVar3 = strcmp(pcVar7,__s2);
      if (iVar3 == 0) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&local_70,1);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        uVar4 = atoi(pcVar7);
        *(ulong *)((long)&profile_local->field_2 + 4) =
             *(ulong *)((long)&profile_local->field_2 + 4) & 0xffffffffffc07fff |
             ((ulong)uVar4 & 0x7f) << 0xf;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&local_70,2);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        iVar3 = atoi(pcVar7);
        *(ulong *)((long)&profile_local->field_2 + 4) =
             *(ulong *)((long)&profile_local->field_2 + 4) & 0xffff0000ffffffff |
             ((ulong)(uint)(iVar3 + local_34) & 0xffff) << 0x20;
        break;
      }
      local_70 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator+(&local_70,3);
    }
  }
LAB_00644ccf:
  local_98 = (undefined1  [8])&spaceDesc;
  crackSpace.spaceDesc = (TString **)((long)&crackSpace.setNumber + 4);
  if ((spaceDesc != (TString *)0x0) &&
     (bVar2 = TQualifier::hasSet((TQualifier *)profile_local), !bVar2)) {
    bVar2 = handleRegister::anon_class_16_2_916c425d::operator()
                      ((anon_class_16_2_916c425d *)local_98);
    if (bVar2) {
      *(ulong *)((long)&profile_local->field_2 + 4) =
           *(ulong *)((long)&profile_local->field_2 + 4) & 0xffffffffffc07fff |
           ((ulong)crackSpace.setNumber._4_4_ & 0x7f) << 0xf;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,qualifier_local,"expected spaceN","register","");
    }
  }
  return;
}

Assistant:

void HlslParseContext::handleRegister(const TSourceLoc& loc, TQualifier& qualifier, const glslang::TString* profile,
                                      const glslang::TString& desc, int subComponent, const glslang::TString* spaceDesc)
{
    if (profile != nullptr)
        warn(loc, "ignoring shader_profile", "register", "");

    if (desc.size() < 1) {
        error(loc, "expected register type", "register", "");
        return;
    }

    int regNumber = 0;
    if (desc.size() > 1) {
        if (isdigit(desc[1]))
            regNumber = atoi(desc.substr(1, desc.size()).c_str());
        else {
            error(loc, "expected register number after register type", "register", "");
            return;
        }
    }

    // more information about register types see
    // https://docs.microsoft.com/en-us/windows/desktop/direct3dhlsl/dx-graphics-hlsl-variable-register
    const std::vector<std::string>& resourceInfo = intermediate.getResourceSetBinding();
    switch (std::tolower(desc[0])) {
    case 'c':
        // c register is the register slot in the global const buffer
        // each slot is a vector of 4 32 bit components
        qualifier.layoutOffset = regNumber * 4 * 4;
        break;
        // const buffer register slot
    case 'b':
        // textrues and structured buffers
    case 't':
        // samplers
    case 's':
        // uav resources
    case 'u':
        // if nothing else has set the binding, do so now
        // (other mechanisms override this one)
        if (!qualifier.hasBinding())
            qualifier.layoutBinding = regNumber + subComponent;

        // This handles per-register layout sets numbers.  For the global mode which sets
        // every symbol to the same value, see setLinkageLayoutSets().
        if ((resourceInfo.size() % 3) == 0) {
            // Apply per-symbol resource set and binding.
            for (auto it = resourceInfo.cbegin(); it != resourceInfo.cend(); it = it + 3) {
                if (strcmp(desc.c_str(), it[0].c_str()) == 0) {
                    qualifier.layoutSet = atoi(it[1].c_str());
                    qualifier.layoutBinding = atoi(it[2].c_str()) + subComponent;
                    break;
                }
            }
        }
        break;
    default:
        warn(loc, "ignoring unrecognized register type", "register", "%c", desc[0]);
        break;
    }

    // space
    unsigned int setNumber;
    const auto crackSpace = [&]() -> bool {
        const int spaceLen = 5;
        if (spaceDesc->size() < spaceLen + 1)
            return false;
        if (spaceDesc->compare(0, spaceLen, "space") != 0)
            return false;
        if (! isdigit((*spaceDesc)[spaceLen]))
            return false;
        setNumber = atoi(spaceDesc->substr(spaceLen, spaceDesc->size()).c_str());
        return true;
    };

    // if nothing else has set the set, do so now
    // (other mechanisms override this one)
    if (spaceDesc && !qualifier.hasSet()) {
        if (! crackSpace()) {
            error(loc, "expected spaceN", "register", "");
            return;
        }
        qualifier.layoutSet = setNumber;
    }
}